

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O3

void __thiscall
ExtraData::parseCURRENCY
          (ExtraData *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *val,int pos)

{
  ostream *poVar1;
  longlong lVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,Utils::defaultOffsetDocInfo_abi_cxx11_._M_dataplus._M_p,
                      Utils::defaultOffsetDocInfo_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"MUST be a CURRENCY (Packet Version).",0x24);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"              Value:                ",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"$ ",2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_38,val);
  lVar2 = Utils::vectEightBytesToUnsignedInt(&local_38,pos);
  poVar1 = std::ostream::_M_insert<double>((double)lVar2 / 10000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ExtraData::parseCURRENCY(std::vector<unsigned int> val, int pos) {
    cout << Utils::defaultOffsetDocInfo << "MUST be a CURRENCY (Packet Version)." << endl;
    cout << "              Value:                ";
    cout << "$ " << (double)Utils::vectEightBytesToUnsignedInt(val, pos)/10000 << endl;
}